

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5HashWrite
              (Fts5Hash *pHash,i64 iRowid,int iCol,int iPos,char bByte,char *pToken,int nToken)

{
  i16 iVar1;
  undefined2 uVar2;
  int iVar3;
  Fts5HashEntry *pFVar4;
  bool bVar5;
  Fts5HashEntry *local_90;
  Fts5HashEntry **pp;
  Fts5HashEntry *pNew;
  sqlite3_int64 nNew;
  sqlite3_uint64 sStack_70;
  int rc;
  sqlite3_int64 nByte;
  char *zKey_1;
  char *zKey;
  int bNew;
  int nIncr;
  u8 *pPtr;
  Fts5HashEntry *p;
  uint iHash;
  char *pToken_local;
  int local_28;
  char bByte_local;
  int iPos_local;
  int iCol_local;
  i64 iRowid_local;
  Fts5Hash *pHash_local;
  
  bVar5 = pHash->eDetail == 0;
  p._4_4_ = fts5HashKey2(pHash->nSlot,bByte,(u8 *)pToken,nToken);
  pPtr = (u8 *)pHash->aSlot[p._4_4_];
  while ((pPtr != (u8 *)0x0 &&
         (((pPtr[0x30] != bByte || (*(int *)(pPtr + 0x1c) != nToken)) ||
          (iVar3 = memcmp(pPtr + 0x31,pToken,(long)nToken), iVar3 != 0))))) {
    pPtr = *(u8 **)pPtr;
  }
  if (pPtr == (u8 *)0x0) {
    sStack_70 = (long)(nToken + 1) + 0x71;
    if ((long)sStack_70 < 0x80) {
      sStack_70 = 0x80;
    }
    if (pHash->nSlot <= pHash->nEntry * 2) {
      iVar3 = fts5HashResize(pHash);
      if (iVar3 != 0) {
        return iVar3;
      }
      p._4_4_ = fts5HashKey2(pHash->nSlot,bByte,(u8 *)pToken,nToken);
    }
    pPtr = (u8 *)sqlite3_malloc64(sStack_70);
    if ((Fts5HashEntry *)pPtr == (Fts5HashEntry *)0x0) {
      return 7;
    }
    memset(pPtr,0,0x30);
    ((Fts5HashEntry *)pPtr)->nAlloc = (int)sStack_70;
    *(char *)&((Fts5HashEntry *)((long)pPtr + 0x30))->pHashNext = bByte;
    memcpy((void *)((long)&((Fts5HashEntry *)((long)pPtr + 0x30))->pHashNext + 1),pToken,
           (long)nToken);
    ((Fts5HashEntry *)pPtr)->nKey = nToken;
    *(undefined1 *)((long)&((Fts5HashEntry *)((long)pPtr + 0x30))->pHashNext + (long)(nToken + 1)) =
         0;
    ((Fts5HashEntry *)pPtr)->nData = nToken + 0x32;
    ((Fts5HashEntry *)pPtr)->pHashNext = pHash->aSlot[p._4_4_];
    pHash->aSlot[p._4_4_] = (Fts5HashEntry *)pPtr;
    pHash->nEntry = pHash->nEntry + 1;
    iVar3 = sqlite3Fts5PutVarint
                      ((uchar *)((long)&((Fts5HashEntry *)pPtr)->pHashNext +
                                (long)((Fts5HashEntry *)pPtr)->nData),iRowid);
    ((Fts5HashEntry *)pPtr)->nData = iVar3 + ((Fts5HashEntry *)pPtr)->nData;
    ((Fts5HashEntry *)pPtr)->iRowid = iRowid;
    ((Fts5HashEntry *)pPtr)->iSzPoslist = ((Fts5HashEntry *)pPtr)->nData;
    if (pHash->eDetail != 1) {
      ((Fts5HashEntry *)pPtr)->nData = ((Fts5HashEntry *)pPtr)->nData + 1;
      iVar1 = -1;
      if (pHash->eDetail == 0) {
        iVar1 = 0;
      }
      ((Fts5HashEntry *)pPtr)->iCol = iVar1;
    }
    zKey._4_4_ = ((Fts5HashEntry *)pPtr)->nData;
  }
  else {
    if (*(int *)(pPtr + 0x10) - *(int *)(pPtr + 0x18) < 0x16) {
      iVar3 = *(int *)(pPtr + 0x10);
      pFVar4 = (Fts5HashEntry *)sqlite3_realloc64(pPtr,(long)(iVar3 << 1));
      if (pFVar4 == (Fts5HashEntry *)0x0) {
        return 7;
      }
      pFVar4->nAlloc = iVar3 << 1;
      for (local_90 = (Fts5HashEntry *)(pHash->aSlot + p._4_4_);
          local_90->pHashNext != (Fts5HashEntry *)pPtr; local_90 = local_90->pHashNext) {
      }
      local_90->pHashNext = pFVar4;
      pPtr = (u8 *)pFVar4;
    }
    zKey._4_4_ = -*(int *)(pPtr + 0x18);
  }
  if (iRowid != *(long *)(pPtr + 0x28)) {
    fts5HashAddPoslistSize(pHash,(Fts5HashEntry *)pPtr,(Fts5HashEntry *)0x0);
    iVar3 = sqlite3Fts5PutVarint(pPtr + *(int *)(pPtr + 0x18),iRowid - *(long *)(pPtr + 0x28));
    *(int *)(pPtr + 0x18) = iVar3 + *(int *)(pPtr + 0x18);
    *(i64 *)(pPtr + 0x28) = iRowid;
    bVar5 = true;
    *(undefined4 *)(pPtr + 0x14) = *(undefined4 *)(pPtr + 0x18);
    if (pHash->eDetail != 1) {
      *(int *)(pPtr + 0x18) = *(int *)(pPtr + 0x18) + 1;
      uVar2 = 0xffff;
      if (pHash->eDetail == 0) {
        uVar2 = 0;
      }
      *(undefined2 *)(pPtr + 0x22) = uVar2;
      pPtr[0x24] = '\0';
      pPtr[0x25] = '\0';
      pPtr[0x26] = '\0';
      pPtr[0x27] = '\0';
    }
  }
  if (iCol < 0) {
    pPtr[0x20] = '\x01';
  }
  else if (pHash->eDetail == 1) {
    pPtr[0x21] = '\x01';
  }
  else {
    local_28 = iPos;
    if (iCol != *(short *)(pPtr + 0x22)) {
      if (pHash->eDetail == 0) {
        iVar3 = *(int *)(pPtr + 0x18);
        *(int *)(pPtr + 0x18) = iVar3 + 1;
        pPtr[iVar3] = '\x01';
        iVar3 = sqlite3Fts5PutVarint(pPtr + *(int *)(pPtr + 0x18),(long)iCol);
        *(int *)(pPtr + 0x18) = iVar3 + *(int *)(pPtr + 0x18);
        *(short *)(pPtr + 0x22) = (short)iCol;
        pPtr[0x24] = '\0';
        pPtr[0x25] = '\0';
        pPtr[0x26] = '\0';
        pPtr[0x27] = '\0';
      }
      else {
        bVar5 = true;
        *(short *)(pPtr + 0x22) = (short)iCol;
        local_28 = iCol;
      }
    }
    if (bVar5) {
      iVar3 = sqlite3Fts5PutVarint
                        (pPtr + *(int *)(pPtr + 0x18),(long)((local_28 - *(int *)(pPtr + 0x24)) + 2)
                        );
      *(int *)(pPtr + 0x18) = iVar3 + *(int *)(pPtr + 0x18);
      *(int *)(pPtr + 0x24) = local_28;
    }
  }
  *pHash->pnByte = *(int *)(pPtr + 0x18) + zKey._4_4_ + *pHash->pnByte;
  return 0;
}

Assistant:

static int sqlite3Fts5HashWrite(
  Fts5Hash *pHash,
  i64 iRowid,                     /* Rowid for this entry */
  int iCol,                       /* Column token appears in (-ve -> delete) */
  int iPos,                       /* Position of token within column */
  char bByte,                     /* First byte of token */
  const char *pToken, int nToken  /* Token to add or remove to or from index */
){
  unsigned int iHash;
  Fts5HashEntry *p;
  u8 *pPtr;
  int nIncr = 0;                  /* Amount to increment (*pHash->pnByte) by */
  int bNew;                       /* If non-delete entry should be written */
  
  bNew = (pHash->eDetail==FTS5_DETAIL_FULL);

  /* Attempt to locate an existing hash entry */
  iHash = fts5HashKey2(pHash->nSlot, (u8)bByte, (const u8*)pToken, nToken);
  for(p=pHash->aSlot[iHash]; p; p=p->pHashNext){
    char *zKey = fts5EntryKey(p);
    if( zKey[0]==bByte 
     && p->nKey==nToken
     && memcmp(&zKey[1], pToken, nToken)==0 
    ){
      break;
    }
  }

  /* If an existing hash entry cannot be found, create a new one. */
  if( p==0 ){
    /* Figure out how much space to allocate */
    char *zKey;
    sqlite3_int64 nByte = sizeof(Fts5HashEntry) + (nToken+1) + 1 + 64;
    if( nByte<128 ) nByte = 128;

    /* Grow the Fts5Hash.aSlot[] array if necessary. */
    if( (pHash->nEntry*2)>=pHash->nSlot ){
      int rc = fts5HashResize(pHash);
      if( rc!=SQLITE_OK ) return rc;
      iHash = fts5HashKey2(pHash->nSlot, (u8)bByte, (const u8*)pToken, nToken);
    }

    /* Allocate new Fts5HashEntry and add it to the hash table. */
    p = (Fts5HashEntry*)sqlite3_malloc64(nByte);
    if( !p ) return SQLITE_NOMEM;
    memset(p, 0, sizeof(Fts5HashEntry));
    p->nAlloc = (int)nByte;
    zKey = fts5EntryKey(p);
    zKey[0] = bByte;
    memcpy(&zKey[1], pToken, nToken);
    assert( iHash==fts5HashKey(pHash->nSlot, (u8*)zKey, nToken+1) );
    p->nKey = nToken;
    zKey[nToken+1] = '\0';
    p->nData = nToken+1 + 1 + sizeof(Fts5HashEntry);
    p->pHashNext = pHash->aSlot[iHash];
    pHash->aSlot[iHash] = p;
    pHash->nEntry++;

    /* Add the first rowid field to the hash-entry */
    p->nData += sqlite3Fts5PutVarint(&((u8*)p)[p->nData], iRowid);
    p->iRowid = iRowid;

    p->iSzPoslist = p->nData;
    if( pHash->eDetail!=FTS5_DETAIL_NONE ){
      p->nData += 1;
      p->iCol = (pHash->eDetail==FTS5_DETAIL_FULL ? 0 : -1);
    }

    nIncr += p->nData;
  }else{

    /* Appending to an existing hash-entry. Check that there is enough 
    ** space to append the largest possible new entry. Worst case scenario 
    ** is:
    **
    **     + 9 bytes for a new rowid,
    **     + 4 byte reserved for the "poslist size" varint.
    **     + 1 byte for a "new column" byte,
    **     + 3 bytes for a new column number (16-bit max) as a varint,
    **     + 5 bytes for the new position offset (32-bit max).
    */
    if( (p->nAlloc - p->nData) < (9 + 4 + 1 + 3 + 5) ){
      sqlite3_int64 nNew = p->nAlloc * 2;
      Fts5HashEntry *pNew;
      Fts5HashEntry **pp;
      pNew = (Fts5HashEntry*)sqlite3_realloc64(p, nNew);
      if( pNew==0 ) return SQLITE_NOMEM;
      pNew->nAlloc = (int)nNew;
      for(pp=&pHash->aSlot[iHash]; *pp!=p; pp=&(*pp)->pHashNext);
      *pp = pNew;
      p = pNew;
    }
    nIncr -= p->nData;
  }
  assert( (p->nAlloc - p->nData) >= (9 + 4 + 1 + 3 + 5) );

  pPtr = (u8*)p;

  /* If this is a new rowid, append the 4-byte size field for the previous
  ** entry, and the new rowid for this entry.  */
  if( iRowid!=p->iRowid ){
    fts5HashAddPoslistSize(pHash, p, 0);
    p->nData += sqlite3Fts5PutVarint(&pPtr[p->nData], iRowid - p->iRowid);
    p->iRowid = iRowid;
    bNew = 1;
    p->iSzPoslist = p->nData;
    if( pHash->eDetail!=FTS5_DETAIL_NONE ){
      p->nData += 1;
      p->iCol = (pHash->eDetail==FTS5_DETAIL_FULL ? 0 : -1);
      p->iPos = 0;
    }
  }

  if( iCol>=0 ){
    if( pHash->eDetail==FTS5_DETAIL_NONE ){
      p->bContent = 1;
    }else{
      /* Append a new column value, if necessary */
      assert( iCol>=p->iCol );
      if( iCol!=p->iCol ){
        if( pHash->eDetail==FTS5_DETAIL_FULL ){
          pPtr[p->nData++] = 0x01;
          p->nData += sqlite3Fts5PutVarint(&pPtr[p->nData], iCol);
          p->iCol = (i16)iCol;
          p->iPos = 0;
        }else{
          bNew = 1;
          p->iCol = (i16)(iPos = iCol);
        }
      }

      /* Append the new position offset, if necessary */
      if( bNew ){
        p->nData += sqlite3Fts5PutVarint(&pPtr[p->nData], iPos - p->iPos + 2);
        p->iPos = iPos;
      }
    }
  }else{
    /* This is a delete. Set the delete flag. */
    p->bDel = 1;
  }

  nIncr += p->nData;
  *pHash->pnByte += nIncr;
  return SQLITE_OK;
}